

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeStencilSFail
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          PixelBufferAccess *stencilBuffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int x;
  uint uVar6;
  int regSampleNdx;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = ~(-1 << ((byte)numStencilBits & 0x1f));
  uVar5 = stencilState->ref;
  uVar6 = uVar8;
  if ((int)uVar5 < (int)uVar8) {
    uVar6 = uVar5;
  }
  uVar3 = 0;
  if (-1 < (int)uVar5) {
    uVar3 = uVar6;
  }
  switch(stencilState->sFail) {
  case STENCILOP_KEEP:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        x = (int)((long)uVar1 % (long)numSamplesPerFragment);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,x,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,x,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_ZERO:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,~stencilState->writeMask & uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_REPLACE:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar3 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_INCR:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar3 + 1;
        uVar6 = uVar8;
        if ((int)uVar5 < (int)uVar8) {
          uVar6 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar6 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar6 ^ uVar3) & stencilState->writeMask ^ uVar3,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_DECR:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar3 - 1;
        uVar6 = uVar8;
        if ((int)uVar5 < (int)uVar8) {
          uVar6 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar6 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar6 ^ uVar3) & stencilState->writeMask ^ uVar3,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_INCR_WRAP:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 + 1 & uVar8 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_DECR_WRAP:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 - 1 & uVar8 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
    break;
  case STENCILOP_INVERT:
    uVar7 = 0;
    do {
      if ((((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) &&
         (this->m_sampleRegister[0].stencilPassed == false)) {
        uVar1 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar8 | uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
      uVar7 = uVar7 + 1;
      this = (FragmentProcessor *)((long)this + 0x84);
    } while (uVar7 != 0x40);
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilSFail (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::PixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_SFAIL(SFAIL_EXPRESSION)																																		\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																									\
	{																																												\
		if (m_sampleRegister[regSampleNdx].isAlive && !m_sampleRegister[regSampleNdx].stencilPassed)																				\
		{																																											\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;																							\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];															\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());											\
																																													\
			stencilBuffer.setPixStencil(maskedBitReplace(stencilBufferValue, (SFAIL_EXPRESSION), stencilState.writeMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
			m_sampleRegister[regSampleNdx].isAlive = false;																															\
		}																																											\
	}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	switch (stencilState.sFail)
	{
		case STENCILOP_KEEP:		SAMPLE_REGISTER_SFAIL(stencilBufferValue)												break;
		case STENCILOP_ZERO:		SAMPLE_REGISTER_SFAIL(0)																break;
		case STENCILOP_REPLACE:		SAMPLE_REGISTER_SFAIL(clampedStencilRef)												break;
		case STENCILOP_INCR:		SAMPLE_REGISTER_SFAIL(de::clamp(stencilBufferValue+1, 0, (1<<numStencilBits) - 1))		break;
		case STENCILOP_DECR:		SAMPLE_REGISTER_SFAIL(de::clamp(stencilBufferValue-1, 0, (1<<numStencilBits) - 1))		break;
		case STENCILOP_INCR_WRAP:	SAMPLE_REGISTER_SFAIL((stencilBufferValue + 1) & ((1<<numStencilBits) - 1))				break;
		case STENCILOP_DECR_WRAP:	SAMPLE_REGISTER_SFAIL((stencilBufferValue - 1) & ((1<<numStencilBits) - 1))				break;
		case STENCILOP_INVERT:		SAMPLE_REGISTER_SFAIL((~stencilBufferValue) & ((1<<numStencilBits) - 1))				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_SFAIL
}